

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * numericItem(int signFactor)

{
  int iVar1;
  ushort **ppuVar2;
  pattern *ppVar3;
  int inscode;
  pattern *rrs;
  pattern *rhs;
  pattern *lhs;
  int signFactor_local;
  
  rhs = makeTerminal(0x134,signFactor * tokenval);
  iVar1 = (int)lexbuf[0];
  matchTok(0x191);
  ppuVar2 = __ctype_b_loc();
  if ((((*ppuVar2)[iVar1] & 0x400) != 0) || (iVar1 == 0x20)) {
    ppVar3 = makeTerminal(0x140,iVar1);
    rhs = makeNode(rhs,ppVar3,0x12d);
  }
  if (lookahead == 0x2d) {
    matchTok(0x2d);
    lhs._4_4_ = 1;
    if (lookahead == 0x2d) {
      matchTok(0x2d);
      lhs._4_4_ = -1;
    }
    rrs = makeTerminal(0x134,lhs._4_4_ * tokenval);
    iVar1 = (int)lexbuf[0];
    matchTok(0x191);
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[iVar1] & 0x400) != 0) || (iVar1 == 0x20)) {
      ppVar3 = makeTerminal(0x140,iVar1);
      rrs = makeNode(rrs,ppVar3,0x12d);
    }
    if ((rhs->type == 0x12d) || (rrs->type == 0x12d)) {
      rhs = makeNode(rhs,rrs,0x141);
    }
    else {
      rhs = makeNode(rhs,rrs,0x12f);
    }
  }
  return rhs;
}

Assistant:

pattern* numericItem(int signFactor) {
   pattern *lhs, *rhs, *rrs;
   int inscode = 0;

   lhs = makeTerminal(RES_NODE, signFactor*tokenval);
   inscode = lexbuf[0];
   matchTok(NUM_TOK);

   if (isalpha(inscode) || inscode == ' ') { /* combine res# with insert code */
      rhs = makeTerminal(INS_NODE, inscode);
      lhs = makeNode(lhs, rhs, AND_NODE);
   }

   if (lookahead == '-') { /* first dash is the range separator */
      matchTok('-');

      signFactor = +1;
      if (lookahead == '-') { /* this dash specifies a negative num */
         matchTok('-');
         signFactor = -1;
      }
      rhs = makeTerminal(RES_NODE, signFactor*tokenval);
      inscode = lexbuf[0];
      matchTok(NUM_TOK);

      if (isalpha(inscode) || inscode == ' ') {  /* combine res# with insert code */
         rrs = makeTerminal(INS_NODE, inscode);
         rhs = makeNode(rhs, rrs, AND_NODE);
      }

      if ((lhs->type == AND_NODE)|| (rhs->type == AND_NODE)) {
        /* more than just a span of numbers */
	/* includes insert codes            */
        lhs = makeNode(lhs, rhs, INS_RANGE_NODE);
      }
      else {
        lhs = makeNode(lhs, rhs, RANGE_NODE);
      }
   }
   return lhs;
}